

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rbuCreateTargetSchema(sqlite3rbu *p)

{
  char **pzErrMsg;
  sqlite3_stmt *pStmt;
  int iVar1;
  uchar *zSql;
  sqlite3_value *pValue;
  int i;
  sqlite3_stmt *psVar2;
  sqlite3_stmt *pSql;
  sqlite3_stmt *pInsert;
  sqlite3_stmt *local_38;
  sqlite3_stmt *local_30;
  
  psVar2 = (sqlite3_stmt *)0x0;
  local_38 = (sqlite3_stmt *)0x0;
  local_30 = (sqlite3_stmt *)0x0;
  pzErrMsg = &p->zErrmsg;
  iVar1 = sqlite3_exec(p->dbMain,"PRAGMA writable_schema=1",(sqlite3_callback)0x0,(void *)0x0,
                       pzErrMsg);
  p->rc = iVar1;
  if (iVar1 == 0) {
    iVar1 = prepareAndCollectError
                      (p->dbRbu,&local_38,pzErrMsg,
                       "SELECT sql FROM sqlite_master WHERE sql!=\'\' AND rootpage!=0 AND name!=\'sqlite_sequence\'  ORDER BY type DESC"
                      );
    psVar2 = local_38;
    p->rc = iVar1;
    while ((iVar1 == 0 && (iVar1 = sqlite3_step(psVar2), iVar1 == 100))) {
      zSql = sqlite3_column_text(psVar2,0);
      iVar1 = sqlite3_exec(p->dbMain,(char *)zSql,(sqlite3_callback)0x0,(void *)0x0,pzErrMsg);
      p->rc = iVar1;
    }
  }
  rbuFinalize(p,psVar2);
  if (p->rc != 0) {
    return;
  }
  iVar1 = prepareAndCollectError
                    (p->dbRbu,&local_38,pzErrMsg,
                     "SELECT * FROM sqlite_master WHERE rootpage=0 OR rootpage IS NULL");
  p->rc = iVar1;
  if (iVar1 == 0) {
    iVar1 = prepareAndCollectError
                      (p->dbMain,&local_30,pzErrMsg,"INSERT INTO sqlite_master VALUES(?,?,?,?,?)");
    pStmt = local_30;
    psVar2 = local_38;
    p->rc = iVar1;
    while (iVar1 == 0) {
      iVar1 = sqlite3_step(psVar2);
      if (iVar1 != 100) {
        if (p->rc == 0) {
          iVar1 = sqlite3_exec(p->dbMain,"PRAGMA writable_schema=0",(sqlite3_callback)0x0,
                               (void *)0x0,pzErrMsg);
          p->rc = iVar1;
        }
        break;
      }
      iVar1 = 0;
      do {
        i = iVar1 + 1;
        pValue = sqlite3_column_value(psVar2,iVar1);
        sqlite3_bind_value(pStmt,i,pValue);
        iVar1 = i;
      } while (i != 5);
      sqlite3_step(pStmt);
      iVar1 = sqlite3_reset(pStmt);
      p->rc = iVar1;
    }
  }
  rbuFinalize(p,local_38);
  rbuFinalize(p,local_30);
  return;
}

Assistant:

static void rbuCreateTargetSchema(sqlite3rbu *p){
  sqlite3_stmt *pSql = 0;
  sqlite3_stmt *pInsert = 0;

  assert( rbuIsVacuum(p) );
  p->rc = sqlite3_exec(p->dbMain, "PRAGMA writable_schema=1", 0,0, &p->zErrmsg);
  if( p->rc==SQLITE_OK ){
    p->rc = prepareAndCollectError(p->dbRbu, &pSql, &p->zErrmsg, 
      "SELECT sql FROM sqlite_master WHERE sql!='' AND rootpage!=0"
      " AND name!='sqlite_sequence' "
      " ORDER BY type DESC"
    );
  }

  while( p->rc==SQLITE_OK && sqlite3_step(pSql)==SQLITE_ROW ){
    const char *zSql = (const char*)sqlite3_column_text(pSql, 0);
    p->rc = sqlite3_exec(p->dbMain, zSql, 0, 0, &p->zErrmsg);
  }
  rbuFinalize(p, pSql);
  if( p->rc!=SQLITE_OK ) return;

  if( p->rc==SQLITE_OK ){
    p->rc = prepareAndCollectError(p->dbRbu, &pSql, &p->zErrmsg, 
        "SELECT * FROM sqlite_master WHERE rootpage=0 OR rootpage IS NULL" 
    );
  }

  if( p->rc==SQLITE_OK ){
    p->rc = prepareAndCollectError(p->dbMain, &pInsert, &p->zErrmsg, 
        "INSERT INTO sqlite_master VALUES(?,?,?,?,?)"
    );
  }

  while( p->rc==SQLITE_OK && sqlite3_step(pSql)==SQLITE_ROW ){
    int i;
    for(i=0; i<5; i++){
      sqlite3_bind_value(pInsert, i+1, sqlite3_column_value(pSql, i));
    }
    sqlite3_step(pInsert);
    p->rc = sqlite3_reset(pInsert);
  }
  if( p->rc==SQLITE_OK ){
    p->rc = sqlite3_exec(p->dbMain, "PRAGMA writable_schema=0",0,0,&p->zErrmsg);
  }

  rbuFinalize(p, pSql);
  rbuFinalize(p, pInsert);
}